

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O0

void * large_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  byte dependent;
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  rtree_ctx_t *extent_00;
  tsd_t *tsd_00;
  void *__src;
  rtree_ctx_t *in_RCX;
  rtree_t *in_RDX;
  tsdn_t *in_RSI;
  tsd_t *in_RDI;
  uintptr_t in_R8;
  byte in_R9B;
  tcache_t *in_stack_00000008;
  size_t copysize;
  void *ret;
  size_t oldusize;
  extent_t *extent;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  tsd_t *tsd;
  uint8_t state_1;
  uint8_t state;
  rtree_leaf_elm_t *elm;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  uintptr_t bits;
  void *result;
  extent_t *extent_1;
  _Bool slab;
  szind_t szind;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  szind_t ret_1;
  uint8_t state_2;
  rtree_leaf_elm_t *elm_2;
  rtree_leaf_elm_t *elm_3;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  uint maskbits_5;
  uint cumbits_5;
  uint ptrbits_5;
  uintptr_t mask_4;
  uint maskbits_6;
  uint cumbits_6;
  uint ptrbits_6;
  uintptr_t mask_5;
  uint maskbits_7;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_8;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_9;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  uintptr_t bits_1;
  void *result_1;
  _Bool ret_2;
  cache_bin_info_t *bin_info;
  cache_bin_t *bin;
  cache_bin_info_t *bin_info_1;
  cache_bin_t *bin_1;
  size_t ret_3;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  extent_t *in_stack_fffffffffffff5b0;
  tcache_t *in_stack_fffffffffffff5b8;
  arena_t *in_stack_fffffffffffff5c0;
  tsdn_t *in_stack_fffffffffffff5c8;
  rtree_ctx_t *ptr_00;
  undefined4 in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  undefined8 in_stack_fffffffffffff5e8;
  undefined1 zero_00;
  size_t in_stack_fffffffffffff5f0;
  rtree_ctx_t *__n;
  size_t in_stack_fffffffffffff5f8;
  extent_t *extent_01;
  undefined6 in_stack_fffffffffffff610;
  undefined1 in_stack_fffffffffffff616;
  tsd_t *local_9c0;
  rtree_ctx_t local_9b0;
  rtree_t *local_830;
  tsd_t *local_828;
  byte local_819;
  undefined8 local_818;
  tcache_t *local_810;
  rtree_ctx_t *local_808;
  void *local_800;
  tsd_t *local_7f8;
  witness_tsd_t *local_7e0;
  uint8_t local_7c1;
  rtree_ctx_t *local_7a8;
  rtree_ctx_t *local_798;
  uint8_t local_771;
  rtree_leaf_elm_t *local_758;
  byte local_749;
  rtree_t *local_748;
  rtree_ctx_t *local_740;
  rtree_t *local_738;
  tsd_t *local_730;
  extent_t *local_728;
  rtree_leaf_elm_t *local_720;
  byte local_711;
  rtree_t *local_710;
  rtree_ctx_t *local_708;
  rtree_t *local_700;
  tsd_t *local_6f8;
  rtree_leaf_elm_t *local_6f0;
  ulong local_6e8;
  rtree_leaf_elm_t *local_6e0;
  uint local_6d4;
  ulong local_6d0;
  rtree_leaf_elm_t *local_6c8;
  ulong local_6c0;
  rtree_leaf_elm_t *local_6b8;
  uintptr_t local_6b0;
  ulong local_6a8;
  undefined1 local_69a;
  undefined1 local_699;
  rtree_t *local_698;
  rtree_ctx_t *local_690;
  rtree_t *local_688;
  tsd_t *local_680;
  rtree_leaf_elm_t *local_678;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  rtree_t *local_660;
  undefined8 local_658;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  rtree_t *local_640;
  undefined8 local_638;
  uint local_62c;
  undefined4 local_628;
  uint local_624;
  undefined4 local_620;
  undefined4 local_61c;
  rtree_t *local_618;
  undefined8 local_610;
  uint local_604;
  undefined4 local_600;
  uint local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  rtree_t *local_5f0;
  undefined8 local_5e8;
  uint local_5dc;
  undefined4 local_5d8;
  uint local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  rtree_t *local_5c8;
  void *local_5c0;
  byte local_5b1;
  rtree_leaf_elm_t *local_5b0;
  rtree_t *local_5a8;
  tsd_t *local_5a0;
  byte local_591;
  rtree_leaf_elm_t *local_590;
  rtree_t *local_588;
  tsd_t *local_580;
  void *local_578;
  uint local_56c;
  rtree_leaf_elm_t *local_568;
  uint local_560;
  int local_55c;
  void *local_558;
  ulong local_550;
  undefined1 local_541;
  uint local_540;
  byte local_539;
  undefined8 local_538;
  tcache_t *local_530;
  rtree_ctx_t *local_528;
  void *local_520;
  tsd_t *local_518;
  tsd_t *local_510;
  tsd_t *local_508;
  rtree_ctx_t *local_500;
  rtree_ctx_t local_4f8;
  void *local_378;
  tsd_t *local_370;
  rtree_ctx_t *local_368;
  tsd_t *local_360;
  rtree_ctx_t *local_358;
  tsd_t *local_350;
  tsd_t *local_348;
  rtree_ctx_t *local_340;
  uint local_338;
  uint local_334;
  rtree_ctx_t *local_330;
  tsd_t *local_328;
  uint8_t local_319;
  tsd_t *local_318;
  tsd_t *local_310;
  tsd_t *local_308;
  extent_t *local_300;
  byte local_2f1;
  void *local_2f0;
  rtree_ctx_t *local_2e8;
  rtree_t *local_2e0;
  tsd_t *local_2d8;
  ulong local_2d0;
  extent_t *local_2c8;
  byte local_2b9;
  void *local_2b8;
  rtree_ctx_t *local_2b0;
  rtree_t *local_2a8;
  tsd_t *local_2a0;
  extent_t *local_298;
  ulong local_290;
  rtree_leaf_elm_t *local_288;
  uint local_27c;
  ulong local_278;
  rtree_leaf_elm_t *local_270;
  ulong local_268;
  rtree_leaf_elm_t *local_260;
  uintptr_t local_258;
  ulong local_250;
  undefined1 local_242;
  undefined1 local_241;
  void *local_240;
  rtree_ctx_t *local_238;
  rtree_t *local_230;
  tsd_t *local_228;
  extent_t *local_220;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  void *local_208;
  undefined8 local_200;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  void *local_1e8;
  undefined8 local_1e0;
  uint local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  void *local_1c0;
  undefined8 local_1b8;
  uint local_1ac;
  undefined4 local_1a8;
  uint local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  void *local_198;
  undefined8 local_190;
  uint local_184;
  undefined4 local_180;
  uint local_17c;
  undefined4 local_178;
  undefined4 local_174;
  void *local_170;
  void *local_168;
  byte local_159;
  extent_t *local_158;
  rtree_t *local_150;
  tsd_t *local_148;
  byte local_139;
  extent_t *local_138;
  rtree_t *local_130;
  tsd_t *local_128;
  void *local_120;
  uint local_114;
  extent_t *local_110;
  uint local_108;
  int local_104;
  void *local_100;
  undefined1 local_f1;
  cache_bin_info_t *local_f0;
  cache_bin_t *local_e8;
  byte local_dd;
  uint local_dc;
  void *local_d8;
  tcache_t *local_d0;
  tsd_t *local_c8;
  cache_bin_info_t *local_c0;
  cache_bin_t *local_b8;
  byte local_ad;
  uint local_ac;
  void *local_a8;
  tcache_t *local_a0;
  tsd_t *local_98;
  uint local_8c;
  size_t local_88;
  uint local_80;
  uint local_7c;
  tcache_t *local_78;
  void *local_70;
  cache_bin_info_t *local_68;
  cache_bin_t *local_60;
  undefined1 local_51;
  void *local_50;
  cache_bin_info_t *local_48;
  cache_bin_t *local_40;
  undefined1 local_31;
  tcache_t *local_30;
  tsd_t *local_28;
  tcache_t *local_20;
  tsd_t *local_18;
  uint local_c;
  tcache_t *local_8;
  
  zero_00 = (undefined1)((ulong)in_stack_fffffffffffff5e8 >> 0x38);
  dependent = in_R9B & 1;
  local_7a8 = &local_9b0;
  local_830 = in_RDX;
  local_828 = in_RDI;
  if (in_RDI == (tsd_t *)0x0) {
    rtree_ctx_data_init(local_7a8);
    local_798 = local_7a8;
  }
  else {
    local_771 = (in_RDI->state).repr;
    local_798 = &in_RDI->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  local_730 = local_828;
  local_738 = &extents_rtree;
  local_740 = local_798;
  local_748 = local_830;
  local_749 = 1;
  local_6f8 = local_828;
  local_700 = &extents_rtree;
  local_708 = local_798;
  local_710 = local_830;
  local_711 = 1;
  local_680 = local_828;
  local_688 = &extents_rtree;
  local_690 = local_798;
  local_698 = local_830;
  local_699 = 1;
  local_69a = 0;
  local_660 = local_830;
  local_664 = 0x40;
  local_668 = 0x22;
  local_66c = 0x1e;
  uVar2 = (ulong)local_830 >> 0x1e & 0xf;
  local_640 = local_830;
  local_644 = 0x40;
  local_648 = 0x22;
  local_64c = 0x1e;
  local_658 = 0xffffffffc0000000;
  uVar3 = (ulong)local_830 & 0xffffffffc0000000;
  local_6b0 = uVar3;
  local_6a8 = uVar2;
  if (local_798->cache[uVar2].leafkey == uVar3) {
    local_6b8 = local_798->cache[uVar2].leaf;
    local_618 = local_830;
    local_61c = 1;
    local_620 = 0x40;
    local_624 = 0x34;
    local_628 = 0xc;
    local_62c = 0x12;
    local_638 = 0x3ffff;
    local_6c0 = (ulong)local_830 >> 0xc & 0x3ffff;
    local_678 = local_6b8 + local_6c0;
  }
  else if (local_798->l2_cache[0].leafkey == uVar3) {
    local_6c8 = local_798->l2_cache[0].leaf;
    local_798->l2_cache[0].leafkey = local_798->cache[uVar2].leafkey;
    local_690->l2_cache[0].leaf = local_690->cache[local_6a8].leaf;
    local_690->cache[local_6a8].leafkey = local_6b0;
    local_690->cache[local_6a8].leaf = local_6c8;
    local_5f0 = local_698;
    local_5f4 = 1;
    local_5f8 = 0x40;
    local_5fc = 0x34;
    local_600 = 0xc;
    local_604 = 0x12;
    local_610 = 0x3ffff;
    local_6d0 = (ulong)local_698 >> 0xc & 0x3ffff;
    local_678 = local_6c8 + local_6d0;
  }
  else {
    for (local_6d4 = 1; local_6d4 < 8; local_6d4 = local_6d4 + 1) {
      if (local_798->l2_cache[local_6d4].leafkey == uVar3) {
        local_6e0 = local_798->l2_cache[local_6d4].leaf;
        if (local_6d4 == 0) {
          local_798->l2_cache[0].leafkey = local_798->cache[uVar2].leafkey;
          local_690->l2_cache[0].leaf = local_690->cache[local_6a8].leaf;
        }
        else {
          local_798->l2_cache[local_6d4].leafkey = local_798->l2_cache[local_6d4 - 1].leafkey;
          local_798->l2_cache[local_6d4].leaf = local_798->l2_cache[local_6d4 - 1].leaf;
          local_798->l2_cache[local_6d4 - 1].leafkey = local_798->cache[uVar2].leafkey;
          local_798->l2_cache[local_6d4 - 1].leaf = local_798->cache[uVar2].leaf;
        }
        local_690->cache[local_6a8].leafkey = local_6b0;
        local_690->cache[local_6a8].leaf = local_6e0;
        local_5c8 = local_698;
        local_5cc = 1;
        local_5d0 = 0x40;
        local_5d4 = 0x34;
        local_5d8 = 0xc;
        local_5dc = 0x12;
        local_5e8 = 0x3ffff;
        local_6e8 = (ulong)local_698 >> 0xc & 0x3ffff;
        local_678 = local_6e0 + local_6e8;
        goto LAB_0021db7f;
      }
    }
    local_678 = rtree_leaf_elm_lookup_hard
                          (in_RSI,in_RDX,in_RCX,in_R8,(_Bool)dependent,
                           (_Bool)in_stack_fffffffffffff616);
  }
LAB_0021db7f:
  local_720 = local_678;
  if (((local_711 & 1) == 0) && (local_678 == (rtree_leaf_elm_t *)0x0)) {
    local_6f0 = (rtree_leaf_elm_t *)0x0;
  }
  else {
    local_6f0 = local_678;
  }
  local_758 = local_6f0;
  if (((local_749 & 1) == 0) && (local_6f0 == (rtree_leaf_elm_t *)0x0)) {
    local_728 = (extent_t *)0x0;
  }
  else {
    local_5a0 = local_730;
    local_5a8 = local_738;
    local_5b0 = local_6f0;
    local_5b1 = local_749 & 1;
    local_580 = local_730;
    local_588 = local_738;
    local_590 = local_6f0;
    local_56c = (byte)~local_5b1 & 1;
    local_568 = local_6f0;
    zero_00 = 0;
    switch(local_56c) {
    case 0:
      local_55c = 0;
      break;
    case 1:
      local_55c = 2;
    }
    if (local_55c - 1U < 2) {
      local_578 = (local_6f0->le_bits).repr;
    }
    else if (local_55c == 5) {
      local_578 = (local_6f0->le_bits).repr;
    }
    else {
      local_578 = (local_6f0->le_bits).repr;
    }
    local_5c0 = local_578;
    local_558 = local_578;
    local_728 = (extent_t *)(((long)local_578 << 0x10) >> 0x10 & 0xfffffffffffffffe);
    in_stack_fffffffffffff5dc = local_55c;
    local_591 = local_5b1;
    local_560 = local_56c;
  }
  extent_01 = local_728;
  extent_00 = (rtree_ctx_t *)
              extent_usize_get((extent_t *)
                               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
  _Var1 = large_ralloc_no_move
                    ((tsdn_t *)extent_01,(extent_t *)extent_00,in_stack_fffffffffffff5f8,
                     in_stack_fffffffffffff5f0,(_Bool)zero_00);
  if (_Var1) {
    tsd_00 = (tsd_t *)large_ralloc_move_helper
                                (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                                 (size_t)in_stack_fffffffffffff5b8,(size_t)in_stack_fffffffffffff5b0
                                 ,SUB41((uint)in_stack_fffffffffffff5ac >> 0x18,0));
    if (tsd_00 == (tsd_t *)0x0) {
      local_9c0 = (tsd_t *)0x0;
    }
    else {
      hook_invoke_alloc((hook_alloc_t)(in_R8 >> 0x20),
                        (void *)CONCAT17(dependent,
                                         CONCAT16(in_stack_fffffffffffff616,
                                                  in_stack_fffffffffffff610)),(uintptr_t)extent_01,
                        (uintptr_t *)extent_00);
      hook_invoke_dalloc((hook_dalloc_t)((ulong)extent_01 >> 0x20),extent_00,(uintptr_t *)tsd_00);
      ptr_00 = extent_00;
      if (in_RCX < extent_00) {
        ptr_00 = in_RCX;
      }
      __n = ptr_00;
      local_9c0 = tsd_00;
      __src = extent_addr_get(extent_01);
      memcpy(tsd_00,__src,(size_t)__n);
      local_800 = extent_addr_get(extent_01);
      local_810 = in_stack_00000008;
      local_818 = 0;
      local_819 = 1;
      if (in_RDI == (tsd_t *)0x0) {
        local_7e0 = (witness_tsd_t *)0x0;
      }
      else {
        local_7c1 = (in_RDI->state).repr;
        local_7e0 = &in_RDI->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
      }
      local_808 = extent_00;
      local_7f8 = in_RDI;
      witness_assert_depth_to_rank((witness_tsdn_t *)local_7e0,0xc,0);
      local_518 = local_7f8;
      local_520 = local_800;
      local_528 = local_808;
      local_530 = local_810;
      local_538 = local_818;
      local_539 = local_819 & 1;
      if (local_810 == (tcache_t *)0x0) {
        arena_sdalloc_no_tcache
                  ((tsdn_t *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),ptr_00,
                   (size_t)in_RDI);
      }
      else {
        local_340 = local_808;
        if (local_808 < (rtree_ctx_t *)0x1001) {
          local_330 = local_808;
          local_338 = (uint)sz_size2index_tab[(ulong)((long)&local_808->cache[0].leafkey + 7) >> 3];
          local_334 = local_338;
        }
        else {
          local_338 = sz_size2index_compute
                                (CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
        }
        local_540 = local_338;
        local_541 = local_338 < 0x24;
        if ((bool)local_541) {
          local_508 = local_518;
          local_c8 = local_518;
          local_d0 = local_530;
          local_d8 = local_520;
          local_dc = local_338;
          local_dd = local_539 & 1;
          if ((local_dd != 0) && ((opt_junk_free & 1U) != 0)) {
            arena_dalloc_junk_small_impl
                      (in_stack_fffffffffffff5b0,
                       (bin_info_t *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
          }
          local_78 = local_d0;
          local_7c = local_dc;
          local_e8 = local_d0->bins_small + local_dc;
          local_f0 = tcache_bin_info + local_dc;
          local_50 = local_d8;
          local_31 = local_e8->ncached != local_f0->ncached_max;
          local_48 = local_f0;
          local_40 = local_e8;
          if ((bool)local_31) {
            local_e8->ncached = local_e8->ncached + 1;
            local_e8->avail[-(long)local_e8->ncached] = local_d8;
          }
          else {
            tcache_bin_flush_small(local_c8,local_d0,local_e8,local_dc,local_f0->ncached_max >> 1);
            local_60 = local_e8;
            local_68 = local_f0;
            local_70 = local_d8;
            local_f1 = local_e8->ncached != local_f0->ncached_max;
            local_51 = local_f1;
            if ((bool)local_f1) {
              local_e8->ncached = local_e8->ncached + 1;
              local_e8->avail[-(long)local_e8->ncached] = local_d8;
            }
          }
          local_18 = local_c8;
          local_20 = local_d0;
          _Var1 = ticker_tick((ticker_t *)0x21e475);
          if (_Var1) {
            tcache_event_hard(tsd_00,in_stack_fffffffffffff5b8);
          }
        }
        else if (local_338 < nhbins) {
          local_510 = local_518;
          local_98 = local_518;
          local_a0 = local_530;
          local_a8 = local_520;
          local_ac = local_338;
          local_ad = local_539 & 1;
          if ((local_ad != 0) && ((opt_junk_free & 1U) != 0)) {
            local_8c = local_338;
            local_80 = local_338;
            local_88 = sz_index2size_tab[local_338];
            large_dalloc_junk_impl
                      (in_stack_fffffffffffff5b0,
                       CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
          }
          local_8 = local_a0;
          local_c = local_ac;
          local_b8 = local_a0->bins_small + (ulong)local_ac + 5;
          local_c0 = tcache_bin_info + local_ac;
          if (local_b8->ncached == local_c0->ncached_max) {
            tcache_bin_flush_large(local_98,local_b8,local_ac,local_c0->ncached_max >> 1,local_a0);
          }
          local_b8->ncached = local_b8->ncached + 1;
          local_b8->avail[-(long)local_b8->ncached] = local_a8;
          local_28 = local_98;
          local_30 = local_a0;
          _Var1 = ticker_tick((ticker_t *)0x21e68e);
          if (_Var1) {
            tcache_event_hard(tsd_00,in_stack_fffffffffffff5b8);
          }
        }
        else {
          local_370 = local_518;
          local_378 = local_520;
          local_360 = local_518;
          local_368 = &local_4f8;
          local_350 = local_518;
          if (local_518 == (tsd_t *)0x0) {
            rtree_ctx_data_init(local_368);
            local_358 = local_368;
          }
          else {
            local_348 = local_518;
            local_328 = local_518;
            local_318 = local_518;
            local_310 = local_518;
            local_319 = (local_518->state).repr;
            local_308 = local_518;
            local_358 = &local_518->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
          }
          local_500 = local_358;
          local_2d8 = local_370;
          local_2e0 = &extents_rtree;
          local_2e8 = local_358;
          local_2f0 = local_378;
          local_2f1 = 1;
          local_2a0 = local_370;
          local_2a8 = &extents_rtree;
          local_2b0 = local_358;
          local_2b8 = local_378;
          local_2b9 = 1;
          local_228 = local_370;
          local_230 = &extents_rtree;
          local_238 = local_358;
          local_240 = local_378;
          local_241 = 1;
          local_242 = 0;
          local_208 = local_378;
          local_20c = 0x40;
          local_210 = 0x22;
          local_214 = 0x1e;
          uVar2 = (ulong)local_378 >> 0x1e & 0xf;
          local_1e8 = local_378;
          local_1ec = 0x40;
          local_1f0 = 0x22;
          local_1f4 = 0x1e;
          local_200 = 0xffffffffc0000000;
          uVar3 = (ulong)local_378 & 0xffffffffc0000000;
          local_258 = uVar3;
          local_250 = uVar2;
          if (local_358->cache[uVar2].leafkey == uVar3) {
            local_260 = local_358->cache[uVar2].leaf;
            local_1c0 = local_378;
            local_1c4 = 1;
            local_1c8 = 0x40;
            local_1cc = 0x34;
            local_1d0 = 0xc;
            local_1d4 = 0x12;
            local_1e0 = 0x3ffff;
            local_268 = (ulong)local_378 >> 0xc & 0x3ffff;
            local_220 = (extent_t *)(local_260 + local_268);
          }
          else if (local_358->l2_cache[0].leafkey == uVar3) {
            local_270 = local_358->l2_cache[0].leaf;
            local_358->l2_cache[0].leafkey = local_358->cache[uVar2].leafkey;
            local_238->l2_cache[0].leaf = local_238->cache[local_250].leaf;
            local_238->cache[local_250].leafkey = local_258;
            local_238->cache[local_250].leaf = local_270;
            local_198 = local_240;
            local_19c = 1;
            local_1a0 = 0x40;
            local_1a4 = 0x34;
            local_1a8 = 0xc;
            local_1ac = 0x12;
            local_1b8 = 0x3ffff;
            local_278 = (ulong)local_240 >> 0xc & 0x3ffff;
            local_220 = (extent_t *)(local_270 + local_278);
          }
          else {
            for (local_27c = 1; local_27c < 8; local_27c = local_27c + 1) {
              if (local_358->l2_cache[local_27c].leafkey == uVar3) {
                local_288 = local_358->l2_cache[local_27c].leaf;
                if (local_27c == 0) {
                  local_358->l2_cache[0].leafkey = local_358->cache[uVar2].leafkey;
                  local_238->l2_cache[0].leaf = local_238->cache[local_250].leaf;
                }
                else {
                  local_358->l2_cache[local_27c].leafkey =
                       local_358->l2_cache[local_27c - 1].leafkey;
                  local_358->l2_cache[local_27c].leaf = local_358->l2_cache[local_27c - 1].leaf;
                  local_358->l2_cache[local_27c - 1].leafkey = local_358->cache[uVar2].leafkey;
                  local_358->l2_cache[local_27c - 1].leaf = local_358->cache[uVar2].leaf;
                }
                local_238->cache[local_250].leafkey = local_258;
                local_238->cache[local_250].leaf = local_288;
                local_170 = local_240;
                local_174 = 1;
                local_178 = 0x40;
                local_17c = 0x34;
                local_180 = 0xc;
                local_184 = 0x12;
                local_190 = 0x3ffff;
                local_290 = (ulong)local_240 >> 0xc & 0x3ffff;
                local_220 = (extent_t *)(local_288 + local_290);
                goto LAB_0021ef8b;
              }
            }
            local_220 = (extent_t *)
                        rtree_leaf_elm_lookup_hard
                                  (in_RSI,in_RDX,in_RCX,in_R8,(_Bool)dependent,
                                   (_Bool)in_stack_fffffffffffff616);
          }
LAB_0021ef8b:
          local_2c8 = local_220;
          if (((local_2b9 & 1) == 0) && (local_220 == (extent_t *)0x0)) {
            local_298 = (extent_t *)0x0;
          }
          else {
            local_298 = local_220;
          }
          local_300 = local_298;
          if (((local_2f1 & 1) == 0) && (local_298 == (extent_t *)0x0)) {
            local_2d0 = 0;
          }
          else {
            local_148 = local_2d8;
            local_150 = local_2e0;
            local_158 = local_298;
            local_159 = local_2f1 & 1;
            local_128 = local_2d8;
            local_130 = local_2e0;
            local_138 = local_298;
            local_114 = (byte)~local_159 & 1;
            local_110 = local_298;
            in_stack_fffffffffffff5b8 = (tcache_t *)(ulong)local_114;
            switch(local_114) {
            case 0:
              local_104 = 0;
              break;
            case 1:
              local_104 = 2;
            }
            if (local_104 - 1U < 2) {
              local_120 = ((atomic_p_t *)&local_298->e_bits)->repr;
            }
            else if (local_104 == 5) {
              local_120 = ((atomic_p_t *)&local_298->e_bits)->repr;
            }
            else {
              local_120 = ((atomic_p_t *)&local_298->e_bits)->repr;
            }
            local_168 = local_120;
            local_100 = local_120;
            local_2d0 = ((long)local_120 << 0x10) >> 0x10 & 0xfffffffffffffffe;
            in_stack_fffffffffffff5b0 = local_298;
            local_139 = local_159;
            local_108 = local_114;
          }
          local_550 = local_2d0;
          large_dalloc((tsdn_t *)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
        }
      }
    }
  }
  else {
    hook_invoke_expand((hook_expand_t)((ulong)in_RDX >> 0x20),in_RCX,in_R8,
                       CONCAT17(dependent,
                                CONCAT16(in_stack_fffffffffffff616,in_stack_fffffffffffff610)),
                       (uintptr_t)extent_01,(uintptr_t *)extent_00);
    local_9c0 = (tsd_t *)extent_addr_get(extent_01);
  }
  return local_9c0;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	extent_t *extent = iealloc(tsdn, ptr);

	size_t oldusize = extent_usize_get(extent);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, extent, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return extent_addr_get(extent);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, extent_addr_get(extent), copysize);
	isdalloct(tsdn, extent_addr_get(extent), oldusize, tcache, NULL, true);
	return ret;
}